

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

void __thiscall spirv_cross::ParsedIR::mark_used_as_array_length(ParsedIR *this,ID id)

{
  Types TVar1;
  int iVar2;
  size_t sVar3;
  SPIRConstantOp *pSVar4;
  SPIRConstant *pSVar5;
  long lVar6;
  uint32_t *puVar7;
  
  do {
    TVar1 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr[id.id].type;
    if (TVar1 != TypeConstantOp) {
      if (TVar1 != TypeUndef) {
        if (TVar1 != TypeConstant) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                        ,0x225,"void spirv_cross::ParsedIR::mark_used_as_array_length(ID)");
        }
        pSVar5 = get<spirv_cross::SPIRConstant>(this,id.id);
        pSVar5->is_used_as_array_length = true;
      }
      return;
    }
    pSVar4 = get<spirv_cross::SPIRConstantOp>(this,id.id);
    iVar2 = *(int *)&(pSVar4->super_IVariant).field_0xc;
    puVar7 = (pSVar4->arguments).super_VectorView<unsigned_int>.ptr;
    if (iVar2 == 0x52) {
      mark_used_as_array_length(this,(ID)*puVar7);
      puVar7 = (pSVar4->arguments).super_VectorView<unsigned_int>.ptr + 1;
    }
    else if (iVar2 != 0x51) {
      sVar3 = (pSVar4->arguments).super_VectorView<unsigned_int>.buffer_size;
      for (lVar6 = 0; sVar3 << 2 != lVar6; lVar6 = lVar6 + 4) {
        mark_used_as_array_length(this,(ID)*(uint32_t *)((long)puVar7 + lVar6));
      }
      return;
    }
    id.id = *puVar7;
  } while( true );
}

Assistant:

void ParsedIR::mark_used_as_array_length(ID id)
{
	switch (ids[id].get_type())
	{
	case TypeConstant:
		get<SPIRConstant>(id).is_used_as_array_length = true;
		break;

	case TypeConstantOp:
	{
		auto &cop = get<SPIRConstantOp>(id);
		if (cop.opcode == OpCompositeExtract)
			mark_used_as_array_length(cop.arguments[0]);
		else if (cop.opcode == OpCompositeInsert)
		{
			mark_used_as_array_length(cop.arguments[0]);
			mark_used_as_array_length(cop.arguments[1]);
		}
		else
			for (uint32_t arg_id : cop.arguments)
				mark_used_as_array_length(arg_id);
		break;
	}

	case TypeUndef:
		break;

	default:
		assert(0);
	}
}